

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O0

void deSingleton_selfTest(void)

{
  int numThreads_00;
  int initTimeMs_00;
  int iVar1;
  int local_7c;
  int subCaseNdx;
  int repeatCount;
  int initTimeMs;
  int numThreads;
  int caseNdx;
  anon_struct_12_3_48501760 cases [7];
  
  memcpy(&numThreads,&DAT_00108830,0x54);
  for (initTimeMs = 0; initTimeMs < 7; initTimeMs = initTimeMs + 1) {
    numThreads_00 = (&numThreads)[(long)initTimeMs * 3];
    initTimeMs_00 = cases[(long)initTimeMs + -1].repeatCount;
    iVar1 = cases[initTimeMs].numThreads;
    for (local_7c = 0; local_7c < iVar1; local_7c = local_7c + 1) {
      runSingletonThreadedTest(numThreads_00,initTimeMs_00);
    }
  }
  return;
}

Assistant:

void deSingleton_selfTest (void)
{
	const struct
	{
		int		numThreads;
		int		initTimeMs;
		int		repeatCount;
	} cases[] =
	{
	/*	#threads	time	#repeat	*/
		{ 1,		-1,		5	},
		{ 1,		1,		5	},
		{ 2,		-1,		20	},
		{ 2,		1,		20	},
		{ 4,		-1,		20	},
		{ 4,		1,		20	},
		{ 4,		5,		20	}
	};
	int caseNdx;

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		int		numThreads		= cases[caseNdx].numThreads;
		int		initTimeMs		= cases[caseNdx].initTimeMs;
		int		repeatCount		= cases[caseNdx].repeatCount;
		int		subCaseNdx;

		for (subCaseNdx = 0; subCaseNdx < repeatCount; subCaseNdx++)
			runSingletonThreadedTest(numThreads, initTimeMs);
	}
}